

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::NewPlaceholderFileWithMutexHeld(DescriptorPool *this,string *name)

{
  Tables *pTVar1;
  FileDescriptor *__s;
  string *psVar2;
  FileOptions *pFVar3;
  FileDescriptorTables *pFVar4;
  SourceCodeInfo *pSVar5;
  
  if (this->mutex_ != (Mutex *)0x0) {
    internal::Mutex::AssertHeld(this->mutex_);
  }
  pTVar1 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                     (&this->tables_);
  __s = Tables::Allocate<google::protobuf::FileDescriptor>(pTVar1);
  memset(__s,0,0xc0);
  pTVar1 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                     (&this->tables_);
  psVar2 = Tables::AllocateString(pTVar1,name);
  *(string **)__s = psVar2;
  psVar2 = internal::GetEmptyString_abi_cxx11_();
  *(string **)(__s + 8) = psVar2;
  *(DescriptorPool **)(__s + 0x10) = this;
  pFVar3 = FileOptions::default_instance();
  *(FileOptions **)(__s + 0xa0) = pFVar3;
  pFVar4 = FileDescriptorTables::GetEmptyInstance();
  *(FileDescriptorTables **)(__s + 0xa8) = pFVar4;
  pSVar5 = SourceCodeInfo::default_instance();
  *(SourceCodeInfo **)(__s + 0xb0) = pSVar5;
  __s[0x90] = (FileDescriptor)0x1;
  *(undefined4 *)(__s + 0x8c) = 2;
  __s[0xb8] = (FileDescriptor)0x1;
  return __s;
}

Assistant:

FileDescriptor* DescriptorPool::NewPlaceholderFileWithMutexHeld(
    const string& name) const {
  if (mutex_) {
    mutex_->AssertHeld();
  }
  FileDescriptor* placeholder = tables_->Allocate<FileDescriptor>();
  memset(placeholder, 0, sizeof(*placeholder));

  placeholder->name_ = tables_->AllocateString(name);
  placeholder->package_ = &internal::GetEmptyString();
  placeholder->pool_ = this;
  placeholder->options_ = &FileOptions::default_instance();
  placeholder->tables_ = &FileDescriptorTables::GetEmptyInstance();
  placeholder->source_code_info_ = &SourceCodeInfo::default_instance();
  placeholder->is_placeholder_ = true;
  placeholder->syntax_ = FileDescriptor::SYNTAX_PROTO2;
  placeholder->finished_building_ = true;
  // All other fields are zero or NULL.

  return placeholder;
}